

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint HuffmanTree_makeFromLengths2(HuffmanTree *tree)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  long in_RDI;
  uint n;
  uint bits;
  uint error;
  uivector nextcode;
  uivector blcount;
  uint local_4c;
  uint in_stack_ffffffffffffffb8;
  uint value;
  uint *in_stack_ffffffffffffffc0;
  uivector *in_stack_ffffffffffffffc8;
  uivector local_28;
  long local_10;
  uint local_4;
  
  value = 0;
  local_10 = in_RDI;
  uivector_init(&local_28);
  uivector_init((uivector *)&stack0xffffffffffffffc0);
  pvVar3 = lodepng_malloc(0x9930e8);
  *(void **)(local_10 + 8) = pvVar3;
  if (*(long *)(local_10 + 8) == 0) {
    value = 0x53;
  }
  uVar2 = uivector_resizev(in_stack_ffffffffffffffc8,(size_t)in_stack_ffffffffffffffc0,value);
  if ((uVar2 == 0) ||
     (uVar2 = uivector_resizev(in_stack_ffffffffffffffc8,(size_t)in_stack_ffffffffffffffc0,value),
     uVar2 == 0)) {
    value = 0x53;
  }
  if (value == 0) {
    for (uVar2 = 0; uVar2 != *(uint *)(local_10 + 0x1c); uVar2 = uVar2 + 1) {
      uVar1 = *(uint *)(*(long *)(local_10 + 0x10) + (ulong)uVar2 * 4);
      local_28.data[uVar1] = local_28.data[uVar1] + 1;
    }
    for (in_stack_ffffffffffffffb8 = 1; in_stack_ffffffffffffffb8 <= *(uint *)(local_10 + 0x18);
        in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 + 1) {
      in_stack_ffffffffffffffc0[in_stack_ffffffffffffffb8] =
           (in_stack_ffffffffffffffc0[in_stack_ffffffffffffffb8 - 1] +
           local_28.data[in_stack_ffffffffffffffb8 - 1]) * 2;
    }
    for (local_4c = 0; local_4c != *(uint *)(local_10 + 0x1c); local_4c = local_4c + 1) {
      if (*(int *)(*(long *)(local_10 + 0x10) + (ulong)local_4c * 4) != 0) {
        uVar2 = *(uint *)(*(long *)(local_10 + 0x10) + (ulong)local_4c * 4);
        uVar1 = in_stack_ffffffffffffffc0[uVar2];
        in_stack_ffffffffffffffc0[uVar2] = uVar1 + 1;
        *(uint *)(*(long *)(local_10 + 8) + (ulong)local_4c * 4) = uVar1;
      }
    }
  }
  uivector_cleanup((void *)0x993263);
  uivector_cleanup((void *)0x99326d);
  local_4 = value;
  if (value == 0) {
    local_4 = HuffmanTree_make2DTree((HuffmanTree *)(ulong)in_stack_ffffffffffffffb8);
  }
  return local_4;
}

Assistant:

static unsigned HuffmanTree_makeFromLengths2(HuffmanTree* tree)
{
  uivector blcount;
  uivector nextcode;
  unsigned error = 0;
  unsigned bits, n;

  uivector_init(&blcount);
  uivector_init(&nextcode);

  tree->tree1d = (unsigned*)lodepng_malloc(tree->numcodes * sizeof(unsigned));
  if(!tree->tree1d) error = 83; /*alloc fail*/

  if(!uivector_resizev(&blcount, tree->maxbitlen + 1, 0)
  || !uivector_resizev(&nextcode, tree->maxbitlen + 1, 0))
    error = 83; /*alloc fail*/

  if(!error)
  {
    /*step 1: count number of instances of each code length*/
    for(bits = 0; bits != tree->numcodes; ++bits) ++blcount.data[tree->lengths[bits]];
    /*step 2: generate the nextcode values*/
    for(bits = 1; bits <= tree->maxbitlen; ++bits)
    {
      nextcode.data[bits] = (nextcode.data[bits - 1] + blcount.data[bits - 1]) << 1;
    }
    /*step 3: generate all the codes*/
    for(n = 0; n != tree->numcodes; ++n)
    {
      if(tree->lengths[n] != 0) tree->tree1d[n] = nextcode.data[tree->lengths[n]]++;
    }
  }

  uivector_cleanup(&blcount);
  uivector_cleanup(&nextcode);

  if(!error) return HuffmanTree_make2DTree(tree);
  else return error;
}